

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O1

void __thiscall
Gudhi::ripser::
Persistent_cohomology<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>_>
::Persistent_cohomology
          (Persistent_cohomology<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>_>
           *this,Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
                 *_filt,dimension_t _dim_max,coefficient_t _modulus)

{
  Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_> *pBVar1;
  dimension_t dVar2;
  undefined3 uVar3;
  value_t vVar4;
  coefficient_t cVar5;
  dimension_t dVar6;
  int iVar7;
  undefined3 in_register_00000011;
  uint m;
  
  std::
  vector<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
  ::vector((vector<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
            *)this,(vector<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
                    *)_filt);
  (this->filt).dist.num_edges = (_filt->dist).num_edges;
  dVar2 = _filt->dim_max;
  uVar3 = *(undefined3 *)&_filt->field_0x25;
  vVar4 = _filt->threshold;
  cVar5 = _filt->modulus;
  (this->filt).n = _filt->n;
  (this->filt).dim_max = dVar2;
  *(undefined3 *)&(this->filt).field_0x25 = uVar3;
  (this->filt).threshold = vVar4;
  (this->filt).modulus = cVar5;
  (this->filt).simplex_encoding = _filt->simplex_encoding;
  (this->filt).vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (_filt->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->filt).vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (_filt->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->filt).vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (_filt->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (_filt->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (_filt->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (_filt->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->filt).bits_for_coeff = _filt->bits_for_coeff;
  iVar7 = (this->filt).n;
  this->n = iVar7;
  iVar7 = iVar7 + -2;
  dVar6 = (dimension_t)iVar7;
  if (CONCAT31(in_register_00000011,_dim_max) <= iVar7) {
    dVar6 = _dim_max;
  }
  this->dim_max = dVar6;
  this->modulus = _modulus;
  multiplicative_inverse_vector<unsigned_short,unsigned_int>
            (&this->multiplicative_inverse_,(ripser *)(ulong)_modulus,m);
  (this->facets).simplex.
  super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
  .first = 0.0;
  pBVar1 = &(this->filt).simplex_encoding;
  (this->cofacet_entries).
  super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cofacet_entries).
  super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cofacet_entries).
  super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->facets).simplex_encoding = pBVar1;
  (this->facets).parent = &this->filt;
  (this->cofacets1).vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cofacets1).vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->cofacets1).vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->cofacets1).vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->cofacets1).dist = (Sparse_distance_matrix<Params> *)this;
  (this->cofacets1).simplex_encoding = pBVar1;
  (this->cofacets1).neighbor_it.
  super__Vector_base<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cofacets1).neighbor_it.
  super__Vector_base<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cofacets1).neighbor_it.
  super__Vector_base<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cofacets1).neighbor_end.
  super__Vector_base<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cofacets1).neighbor_end.
  super__Vector_base<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cofacets1).neighbor_end.
  super__Vector_base<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cofacets1).parent = &this->filt;
  (this->cofacets2).vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cofacets2).vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->cofacets2).vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->cofacets2).vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->cofacets2).dist = (Sparse_distance_matrix<Params> *)this;
  (this->cofacets2).simplex_encoding = pBVar1;
  (this->cofacets2).neighbor_end.
  super__Vector_base<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cofacets2).neighbor_end.
  super__Vector_base<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cofacets2).neighbor_it.
  super__Vector_base<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cofacets2).neighbor_end.
  super__Vector_base<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cofacets2).neighbor_it.
  super__Vector_base<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cofacets2).neighbor_it.
  super__Vector_base<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cofacets2).parent = &this->filt;
  return;
}

Assistant:

Persistent_cohomology(Filtration&& _filt, dimension_t _dim_max, coefficient_t _modulus)
    : filt(std::move(_filt)), n(filt.num_vertices()),
    dim_max(std::min<vertex_t>(_dim_max, n - 2)),
    modulus(_modulus),
    multiplicative_inverse_(multiplicative_inverse_vector<coefficient_storage_t>(_modulus)),
    facets(filt), cofacets1(filt), cofacets2(filt)
  {
    }